

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int FnNoise5_float(float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngood,
                  float *minval,float *maxval,double *noise2,double *noise3,double *noise5,
                  int *status)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  int extraout_EAX;
  double *arr;
  double *arr_00;
  double *__ptr;
  double *__base;
  double *__base_00;
  double *pdVar5;
  double *pdVar6;
  double *extraout_RAX;
  double *pdVar7;
  long lVar8;
  size_t sVar9;
  double *pdVar10;
  int n;
  double *__nmemb;
  float *pfVar11;
  size_t sVar12;
  long lVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  long local_a8;
  size_t local_a0;
  long local_90;
  size_t local_88;
  
  sVar12 = 1;
  if (nx < 9) {
    sVar12 = ny;
    ny = 1;
  }
  __nmemb = (double *)(sVar12 * nx);
  if ((long)__nmemb < 9) {
    arr = (double *)0x0;
    if ((long)__nmemb < 1) {
      __nmemb = arr;
    }
    fVar19 = -3.4028235e+38;
    fVar16 = 3.4028235e+38;
    for (pdVar7 = (double *)0x0; __nmemb != pdVar7; pdVar7 = (double *)((long)pdVar7 + 1)) {
      fVar14 = array[(long)pdVar7];
      if (nullcheck == 0) {
LAB_001e965a:
        fVar26 = fVar14;
        if (fVar16 <= fVar14) {
          fVar26 = fVar16;
        }
        fVar16 = fVar26;
        if (fVar14 <= fVar19) {
          fVar14 = fVar19;
        }
        fVar19 = fVar14;
        arr = (double *)((long)arr + 1);
      }
      else if ((fVar14 != nullvalue) || (NAN(fVar14) || NAN(nullvalue))) goto LAB_001e965a;
    }
    if (minval != (float *)0x0) {
      *minval = fVar16;
    }
    if (maxval != (float *)0x0) {
      *maxval = fVar19;
    }
    if (ngood != (long *)0x0) {
      *ngood = (long)arr;
    }
    if (noise2 != (double *)0x0) {
      *noise2 = 0.0;
    }
    if (noise3 != (double *)0x0) {
      *noise3 = 0.0;
    }
    if (noise5 != (double *)0x0) {
      *noise5 = 0.0;
    }
  }
  else {
    bVar3 = minval != (float *)0x0;
    bVar4 = maxval != (float *)0x0;
    arr = (double *)calloc((size_t)__nmemb,4);
    if (arr != (double *)0x0) {
      pdVar7 = (double *)calloc((size_t)__nmemb,4);
      if (pdVar7 != (double *)0x0) {
        arr_00 = (double *)calloc((size_t)__nmemb,4);
        if (arr_00 == (double *)0x0) {
          free(arr);
          arr = pdVar7;
        }
        else {
          __ptr = (double *)calloc(ny,8);
          if (__ptr == (double *)0x0) {
            free(arr);
            free(pdVar7);
            arr = arr_00;
          }
          else {
            __base = (double *)calloc(ny,8);
            if (__base == (double *)0x0) {
              free(arr);
              free(pdVar7);
              free(arr_00);
              arr = __ptr;
            }
            else {
              __base_00 = (double *)calloc(ny,8);
              if (__base_00 != (double *)0x0) {
                sVar12 = 0;
                if (ny < 1) {
                  ny = sVar12;
                }
                fVar19 = -3.4028235e+38;
                fVar16 = 3.4028235e+38;
                local_a0 = 0;
                local_88 = 0;
                sVar9 = 0;
                pfVar11 = array;
                do {
                  if (sVar9 == ny) {
                    dVar17 = 0.0;
                    dVar18 = 0.0;
                    if (local_88 != 0) {
                      if (local_88 == 1) {
                        dVar17 = *__base;
                        dVar18 = *__base_00;
                      }
                      else {
                        qsort(__base,local_88,8,FnCompare_double);
                        qsort(__base_00,local_88,8,FnCompare_double);
                        lVar8 = (long)(local_88 - 1) / 2;
                        dVar17 = (__base[lVar8] + __base[(long)local_88 / 2]) * 0.5;
                        dVar18 = (__base_00[lVar8] + __base_00[(long)local_88 / 2]) * 0.5;
                      }
                    }
                    dVar15 = 0.0;
                    if (local_a0 != 0) {
                      if (local_a0 == 1) {
                        dVar15 = *__ptr;
                      }
                      else {
                        qsort(__ptr,local_a0,8,FnCompare_double);
                        dVar15 = (__ptr[(long)(local_a0 - 1) / 2] + __ptr[(long)local_a0 / 2]) * 0.5
                        ;
                      }
                    }
                    if (ngood != (long *)0x0) {
                      *ngood = sVar12;
                    }
                    if (minval != (float *)0x0) {
                      *minval = fVar16;
                    }
                    if (maxval != (float *)0x0) {
                      *maxval = fVar19;
                    }
                    if (noise2 != (double *)0x0) {
                      *noise2 = dVar15 * 1.0483579;
                    }
                    if (noise3 != (double *)0x0) {
                      *noise3 = dVar17 * 0.6052697;
                    }
                    if (noise5 != (double *)0x0) {
                      *noise5 = dVar18 * 0.1772048;
                    }
                    free(__base_00);
                    free(__base);
                    free(__ptr);
                    free(arr_00);
                    free(pdVar7);
                    free(arr);
                    return extraout_EAX;
                  }
                  pdVar5 = (double *)0x0;
                  if (nullcheck == 0) {
LAB_001e97e3:
                    if (pdVar5 != __nmemb) {
                      lVar8 = sVar9 * (long)__nmemb;
                      fVar14 = array[(long)(lVar8 + (long)pdVar5)];
                      if (bVar3 || bVar4) {
                        fVar26 = fVar14;
                        if (fVar16 <= fVar14) {
                          fVar26 = fVar16;
                        }
                        fVar16 = fVar26;
                        if (fVar19 < fVar14) {
                          fVar19 = fVar14;
                        }
                      }
                      pdVar5 = (double *)((long)pdVar5 + 1);
                      pdVar6 = pdVar5;
                      if (nullcheck != 0) {
                        pdVar10 = pdVar5;
                        if ((long)__nmemb - (long)pdVar5 != 0 && (long)pdVar5 <= (long)__nmemb) {
                          pdVar10 = __nmemb;
                        }
                        while (((pdVar6 = pdVar10, (long)pdVar5 < (long)__nmemb &&
                                (pdVar6 = pdVar5, pfVar11[(long)pdVar5] == nullvalue)) &&
                               (!NAN(pfVar11[(long)pdVar5]) && !NAN(nullvalue)))) {
                          pdVar5 = (double *)((long)pdVar5 + 1);
                        }
                      }
                      if (pdVar6 == __nmemb) {
                        sVar12 = sVar12 + 1;
                      }
                      else {
                        fVar26 = array[(long)(lVar8 + (long)pdVar6)];
                        if (bVar3 || bVar4) {
                          fVar1 = fVar26;
                          if (fVar16 <= fVar26) {
                            fVar1 = fVar16;
                          }
                          fVar16 = fVar1;
                          if (fVar19 < fVar26) {
                            fVar19 = fVar26;
                          }
                        }
                        pdVar6 = (double *)((long)pdVar6 + 1);
                        pdVar5 = pdVar6;
                        if (nullcheck != 0) {
                          pdVar10 = pdVar6;
                          if ((long)__nmemb - (long)pdVar6 != 0 && (long)pdVar6 <= (long)__nmemb) {
                            pdVar10 = __nmemb;
                          }
                          while (((pdVar5 = pdVar10, (long)pdVar6 < (long)__nmemb &&
                                  (pdVar5 = pdVar6, pfVar11[(long)pdVar6] == nullvalue)) &&
                                 (!NAN(pfVar11[(long)pdVar6]) && !NAN(nullvalue)))) {
                            pdVar6 = (double *)((long)pdVar6 + 1);
                          }
                        }
                        if (pdVar5 == __nmemb) {
                          sVar12 = sVar12 + 2;
                        }
                        else {
                          fVar1 = array[(long)(lVar8 + (long)pdVar5)];
                          if (bVar3 || bVar4) {
                            fVar27 = fVar1;
                            if (fVar16 <= fVar1) {
                              fVar27 = fVar16;
                            }
                            fVar16 = fVar27;
                            if (fVar19 < fVar1) {
                              fVar19 = fVar1;
                            }
                          }
                          pdVar5 = (double *)((long)pdVar5 + 1);
                          pdVar6 = pdVar5;
                          if (nullcheck != 0) {
                            pdVar10 = pdVar5;
                            if ((long)__nmemb - (long)pdVar5 != 0 && (long)pdVar5 <= (long)__nmemb)
                            {
                              pdVar10 = __nmemb;
                            }
                            while (((pdVar6 = pdVar10, (long)pdVar5 < (long)__nmemb &&
                                    (pdVar6 = pdVar5, pfVar11[(long)pdVar5] == nullvalue)) &&
                                   (!NAN(pfVar11[(long)pdVar5]) && !NAN(nullvalue)))) {
                              pdVar5 = (double *)((long)pdVar5 + 1);
                            }
                          }
                          if (pdVar6 == __nmemb) {
                            sVar12 = sVar12 + 3;
                          }
                          else {
                            fVar27 = array[(long)(lVar8 + (long)pdVar6)];
                            if (bVar3 || bVar4) {
                              fVar21 = fVar27;
                              if (fVar16 <= fVar27) {
                                fVar21 = fVar16;
                              }
                              fVar16 = fVar21;
                              if (fVar19 < fVar27) {
                                fVar19 = fVar27;
                              }
                            }
                            pdVar6 = (double *)((long)pdVar6 + 1);
                            pdVar5 = pdVar6;
                            if (nullcheck != 0) {
                              pdVar10 = pdVar6;
                              if ((long)__nmemb - (long)pdVar6 != 0 && (long)pdVar6 <= (long)__nmemb
                                 ) {
                                pdVar10 = __nmemb;
                              }
                              while (((pdVar5 = pdVar10, (long)pdVar6 < (long)__nmemb &&
                                      (pdVar5 = pdVar6, pfVar11[(long)pdVar6] == nullvalue)) &&
                                     (!NAN(pfVar11[(long)pdVar6]) && !NAN(nullvalue)))) {
                                pdVar6 = (double *)((long)pdVar6 + 1);
                              }
                            }
                            if (pdVar5 == __nmemb) {
                              sVar12 = sVar12 + 4;
                            }
                            else {
                              fVar21 = array[(long)(lVar8 + (long)pdVar5)];
                              if (bVar3 || bVar4) {
                                fVar28 = fVar21;
                                if (fVar16 <= fVar21) {
                                  fVar28 = fVar16;
                                }
                                fVar16 = fVar28;
                                if (fVar19 < fVar21) {
                                  fVar19 = fVar21;
                                }
                              }
                              pdVar5 = (double *)((long)pdVar5 + 1);
                              pdVar6 = pdVar5;
                              if (nullcheck != 0) {
                                pdVar10 = pdVar5;
                                if ((long)__nmemb - (long)pdVar5 != 0 &&
                                    (long)pdVar5 <= (long)__nmemb) {
                                  pdVar10 = __nmemb;
                                }
                                while (((pdVar6 = pdVar10, (long)pdVar5 < (long)__nmemb &&
                                        (pdVar6 = pdVar5, pfVar11[(long)pdVar5] == nullvalue)) &&
                                       (!NAN(pfVar11[(long)pdVar5]) && !NAN(nullvalue)))) {
                                  pdVar5 = (double *)((long)pdVar5 + 1);
                                }
                              }
                              if (pdVar6 == __nmemb) {
                                sVar12 = sVar12 + 5;
                              }
                              else {
                                fVar28 = array[(long)(lVar8 + (long)pdVar6)];
                                if (bVar3 || bVar4) {
                                  fVar22 = fVar28;
                                  if (fVar16 <= fVar28) {
                                    fVar22 = fVar16;
                                  }
                                  fVar16 = fVar22;
                                  if (fVar19 < fVar28) {
                                    fVar19 = fVar28;
                                  }
                                }
                                pdVar6 = (double *)((long)pdVar6 + 1);
                                pdVar5 = pdVar6;
                                if (nullcheck != 0) {
                                  pdVar10 = pdVar6;
                                  if ((long)__nmemb - (long)pdVar6 != 0 &&
                                      (long)pdVar6 <= (long)__nmemb) {
                                    pdVar10 = __nmemb;
                                  }
                                  while (((pdVar5 = pdVar10, (long)pdVar6 < (long)__nmemb &&
                                          (pdVar5 = pdVar6, pfVar11[(long)pdVar6] == nullvalue)) &&
                                         (!NAN(pfVar11[(long)pdVar6]) && !NAN(nullvalue)))) {
                                    pdVar6 = (double *)((long)pdVar6 + 1);
                                  }
                                }
                                if (pdVar5 == __nmemb) {
                                  sVar12 = sVar12 + 6;
                                }
                                else {
                                  fVar22 = array[(long)(lVar8 + (long)pdVar5)];
                                  if (bVar3 || bVar4) {
                                    fVar23 = fVar22;
                                    if (fVar16 <= fVar22) {
                                      fVar23 = fVar16;
                                    }
                                    fVar16 = fVar23;
                                    if (fVar19 < fVar22) {
                                      fVar19 = fVar22;
                                    }
                                  }
                                  pdVar5 = (double *)((long)pdVar5 + 1);
                                  pdVar6 = pdVar5;
                                  if (nullcheck != 0) {
                                    pdVar10 = pdVar5;
                                    if ((long)__nmemb - (long)pdVar5 != 0 &&
                                        (long)pdVar5 <= (long)__nmemb) {
                                      pdVar10 = __nmemb;
                                    }
                                    while (((pdVar6 = pdVar10, (long)pdVar5 < (long)__nmemb &&
                                            (pdVar6 = pdVar5, pfVar11[(long)pdVar5] == nullvalue))
                                           && (!NAN(pfVar11[(long)pdVar5]) && !NAN(nullvalue)))) {
                                      pdVar5 = (double *)((long)pdVar5 + 1);
                                    }
                                  }
                                  if (pdVar6 == __nmemb) {
                                    sVar12 = sVar12 + 7;
                                  }
                                  else {
                                    fVar23 = array[(long)(lVar8 + (long)pdVar6)];
                                    if (bVar3 || bVar4) {
                                      fVar24 = fVar23;
                                      if (fVar16 <= fVar23) {
                                        fVar24 = fVar16;
                                      }
                                      fVar16 = fVar24;
                                      if (fVar19 < fVar23) {
                                        fVar19 = fVar23;
                                      }
                                    }
                                    lVar13 = sVar12 + 8;
                                    local_90 = 0;
                                    local_a8 = 0;
                                    while (fVar20 = fVar21, fVar21 = fVar28, fVar24 = fVar1,
                                          pdVar6 = (double *)((long)pdVar6 + 1),
                                          (long)pdVar6 < (long)__nmemb) {
                                      if (nullcheck != 0) {
                                        while( true ) {
                                          if ((long)__nmemb <= (long)pdVar6) goto LAB_001e9c4d;
                                          if ((pfVar11[(long)pdVar6] != nullvalue) ||
                                             (NAN(pfVar11[(long)pdVar6]) || NAN(nullvalue))) break;
                                          pdVar6 = (double *)((long)pdVar6 + 1);
                                        }
                                      }
                                      fVar2 = array[(long)(lVar8 + (long)pdVar6)];
                                      fVar25 = fVar16;
                                      if (bVar3 || bVar4) {
                                        fVar25 = fVar2;
                                        if (fVar16 <= fVar2) {
                                          fVar25 = fVar16;
                                        }
                                        if (fVar19 < fVar2) {
                                          fVar19 = fVar2;
                                        }
                                      }
                                      if (fVar20 == fVar21) {
                                        if ((fVar21 != fVar22) || (NAN(fVar21) || NAN(fVar22)))
                                        goto LAB_001e9b64;
                                      }
                                      else {
LAB_001e9b64:
                                        *(float *)((long)arr + local_90 * 4) = ABS(fVar20 - fVar22);
                                        local_90 = local_90 + 1;
                                      }
                                      fVar1 = fVar27;
                                      fVar28 = fVar22;
                                      fVar16 = fVar25;
                                      if (((fVar24 == fVar27) && (fVar27 == fVar20)) &&
                                         (fVar20 == fVar21)) {
                                        if ((fVar21 != fVar22) || (NAN(fVar21) || NAN(fVar22)))
                                        goto LAB_001e9ba9;
                                        lVar13 = lVar13 + 1;
                                        fVar22 = fVar23;
                                        fVar23 = fVar2;
                                        fVar14 = fVar26;
                                        fVar26 = fVar24;
                                        fVar27 = fVar20;
                                      }
                                      else {
LAB_001e9ba9:
                                        *(float *)((long)pdVar7 + local_a8 * 4) =
                                             ABS(((fVar20 + fVar20) - fVar24) - fVar22);
                                        *(float *)((long)arr_00 + local_a8 * 4) =
                                             ABS(fVar14 + fVar22 * -4.0 +
                                                          fVar20 * 6.0 + fVar24 * -4.0 + fVar2);
                                        local_a8 = local_a8 + 1;
                                        fVar22 = fVar23;
                                        fVar23 = fVar2;
                                        fVar14 = fVar26;
                                        fVar26 = fVar24;
                                        fVar27 = fVar20;
                                      }
                                    }
LAB_001e9c4d:
                                    sVar12 = lVar13 + local_a8;
                                    if (local_a8 != 0) {
                                      if (local_a8 == 1) {
                                        if (local_90 == 1) {
                                          __ptr[local_a0] = (double)*(float *)arr;
                                          local_a0 = local_a0 + 1;
                                        }
                                        __base[local_88] = (double)*(float *)pdVar7;
                                        fVar14 = *(float *)arr_00;
                                      }
                                      else {
                                        n = (int)local_a8;
                                        if (1 < local_90) {
                                          fVar14 = quick_select_float((float *)arr,n);
                                          __ptr[local_a0] = (double)fVar14;
                                          local_a0 = local_a0 + 1;
                                        }
                                        fVar14 = quick_select_float((float *)pdVar7,n);
                                        __base[local_88] = (double)fVar14;
                                        fVar14 = quick_select_float((float *)arr_00,n);
                                      }
                                      __base_00[local_88] = (double)fVar14;
                                      local_88 = local_88 + 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    for (; (long)__nmemb - (long)pdVar5 != 0; pdVar5 = (double *)((long)pdVar5 + 1))
                    {
                      if ((pfVar11[(long)pdVar5] != nullvalue) ||
                         (NAN(pfVar11[(long)pdVar5]) || NAN(nullvalue))) goto LAB_001e97e3;
                    }
                  }
                  sVar9 = sVar9 + 1;
                  pfVar11 = pfVar11 + (long)__nmemb;
                } while( true );
              }
              free(arr);
              free(pdVar7);
              free(arr_00);
              free(__ptr);
              arr = __base;
            }
          }
        }
      }
      free(arr);
      arr = extraout_RAX;
    }
    *status = 0x71;
  }
  return (int)arr;
}

Assistant:

static int FnNoise5_float
       (float *array,       /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
        long ny,            /* number of rows in the image */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */
   /* returned parameters */   
	long *ngood,        /* number of good, non-null pixels? */
	float *minval,    /* minimum non-null value */
	float *maxval,    /* maximum non-null value */
	double *noise2,      /* returned 2nd order MAD of all non-null pixels */
	double *noise3,      /* returned 3rd order MAD of all non-null pixels */
	double *noise5,      /* returned 5th order MAD of all non-null pixels */
	int *status)        /* error status */

/*
Estimate the median and background noise in the input image using 2nd, 3rd and 5th
order Median Absolute Differences.

The noise in the background of the image is calculated using the MAD algorithms 
developed for deriving the signal to noise ratio in spectra
(see issue #42 of the ST-ECF newsletter, http://www.stecf.org/documents/newsletter/)

3rd order:  noise = 1.482602 / sqrt(6) * median (abs(2*flux(i) - flux(i-2) - flux(i+2)))

The returned estimates are the median of the values that are computed for each 
row of the image.
*/
{
	long ii, jj, nrows = 0, nrows2 = 0, nvals, nvals2, ngoodpix = 0;
	float *differences2, *differences3, *differences5;
	float *rowpix, v1, v2, v3, v4, v5, v6, v7, v8, v9;
	float xminval = FLT_MAX, xmaxval = -FLT_MAX;
	int do_range = 0;
	double *diffs2, *diffs3, *diffs5; 
	double xnoise2 = 0, xnoise3 = 0, xnoise5 = 0;
	
	if (nx < 9) {
		/* treat entire array as an image with a single row */
		nx = nx * ny;
		ny = 1;
	}

	/* rows must have at least 9 pixels */
	if (nx < 9) {

		for (ii = 0; ii < nx; ii++) {
		    if (nullcheck && array[ii] == nullvalue)
		        continue;
		    else {
			if (array[ii] < xminval) xminval = array[ii];
			if (array[ii] > xmaxval) xmaxval = array[ii];
			ngoodpix++;
		    }
		}
		if (minval) *minval = xminval;
		if (maxval) *maxval = xmaxval;
		if (ngood) *ngood = ngoodpix;
		if (noise2) *noise2 = 0.;
		if (noise3) *noise3 = 0.;
		if (noise5) *noise5 = 0.;
		return(*status);
	}

	/* do we need to compute the min and max value? */
	if (minval || maxval) do_range = 1;
	
        /* allocate arrays used to compute the median and noise estimates */
	differences2 = calloc(nx, sizeof(float));
	if (!differences2) {
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}
	differences3 = calloc(nx, sizeof(float));
	if (!differences3) {
		free(differences2);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}
	differences5 = calloc(nx, sizeof(float));
	if (!differences5) {
		free(differences2);
		free(differences3);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs2 = calloc(ny, sizeof(double));
	if (!diffs2) {
		free(differences2);
		free(differences3);
		free(differences5);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs3 = calloc(ny, sizeof(double));
	if (!diffs3) {
		free(differences2);
		free(differences3);
		free(differences5);
		free(diffs2);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs5 = calloc(ny, sizeof(double));
	if (!diffs5) {
		free(differences2);
		free(differences3);
		free(differences5);
		free(diffs2);
		free(diffs3);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* loop over each row of the image */
	for (jj=0; jj < ny; jj++) {

                rowpix = array + (jj * nx); /* point to first pixel in the row */

		/***** find the first valid pixel in row */
		ii = 0;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v1 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v1 < xminval) xminval = v1;
			if (v1 > xmaxval) xmaxval = v1;
		}

		/***** find the 2nd valid pixel in row (which we will skip over) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v2 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;
		
		if (do_range) {
			if (v2 < xminval) xminval = v2;
			if (v2 > xmaxval) xmaxval = v2;
		}

		/***** find the 3rd valid pixel in row */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v3 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v3 < xminval) xminval = v3;
			if (v3 > xmaxval) xmaxval = v3;
		}
				
		/* find the 4nd valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v4 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v4 < xminval) xminval = v4;
			if (v4 > xmaxval) xmaxval = v4;
		}
			
		/* find the 5th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v5 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v5 < xminval) xminval = v5;
			if (v5 > xmaxval) xmaxval = v5;
		}
				
		/* find the 6th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v6 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v6 < xminval) xminval = v6;
			if (v6 > xmaxval) xmaxval = v6;
		}
				
		/* find the 7th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v7 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v7 < xminval) xminval = v7;
			if (v7 > xmaxval) xmaxval = v7;
		}
				
		/* find the 8th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v8 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v8 < xminval) xminval = v8;
			if (v8 > xmaxval) xmaxval = v8;
		}
		/* now populate the differences arrays */
		/* for the remaining pixels in the row */
		nvals = 0;
		nvals2 = 0;
		for (ii++; ii < nx; ii++) {

		    /* find the next valid pixel in row */
                    if (nullcheck)
		        while (ii < nx && rowpix[ii] == nullvalue) ii++;
		     
		    if (ii == nx) break;  /* hit end of row */
		    v9 = rowpix[ii];  /* store the good pixel value */

		    if (do_range) {
			if (v9 < xminval) xminval = v9;
			if (v9 > xmaxval) xmaxval = v9;
		    }

		    /* construct array of absolute differences */

		    if (!(v5 == v6 && v6 == v7) ) {
		        differences2[nvals2] = (float) fabs(v5 - v7);
			nvals2++;
		    }

		    if (!(v3 == v4 && v4 == v5 && v5 == v6 && v6 == v7) ) {
		        differences3[nvals] = (float) fabs((2 * v5) - v3 - v7);
		        differences5[nvals] = (float) fabs((6 * v5) - (4 * v3) - (4 * v7) + v1 + v9);
		        nvals++;  
		    } else {
		        /* ignore constant background regions */
			ngoodpix++;
		    }

		    /* shift over 1 pixel */
		    v1 = v2;
		    v2 = v3;
		    v3 = v4;
		    v4 = v5;
		    v5 = v6;
		    v6 = v7;
		    v7 = v8;
		    v8 = v9;
	        }  /* end of loop over pixels in the row */

		/* compute the median diffs */
		/* Note that there are 8 more pixel values than there are diffs values. */
		ngoodpix += nvals;

		if (nvals == 0) {
		    continue;  /* cannot compute medians on this row */
		} else if (nvals == 1) {
		    if (nvals2 == 1) {
		        diffs2[nrows2] = differences2[0];
			nrows2++;
		    }
		        
		    diffs3[nrows] = differences3[0];
		    diffs5[nrows] = differences5[0];
		} else {
                    /* quick_select returns the median MUCH faster than using qsort */
		    if (nvals2 > 1) {
                        diffs2[nrows2] = quick_select_float(differences2, nvals);
			nrows2++;
		    }

                    diffs3[nrows] = quick_select_float(differences3, nvals);
                    diffs5[nrows] = quick_select_float(differences5, nvals);
		}

		nrows++;
	}  /* end of loop over rows */

	    /* compute median of the values for each row */
	if (nrows == 0) { 
	       xnoise3 = 0;
	       xnoise5 = 0;
	} else if (nrows == 1) {
	       xnoise3 = diffs3[0];
	       xnoise5 = diffs5[0];
	} else {	    
	       qsort(diffs3, nrows, sizeof(double), FnCompare_double);
	       qsort(diffs5, nrows, sizeof(double), FnCompare_double);
	       xnoise3 =  (diffs3[(nrows - 1)/2] + diffs3[nrows/2]) / 2.;
	       xnoise5 =  (diffs5[(nrows - 1)/2] + diffs5[nrows/2]) / 2.;
	}

	if (nrows2 == 0) { 
	       xnoise2 = 0;
	} else if (nrows2 == 1) {
	       xnoise2 = diffs2[0];
	} else {	    
	       qsort(diffs2, nrows2, sizeof(double), FnCompare_double);
	       xnoise2 =  (diffs2[(nrows2 - 1)/2] + diffs2[nrows2/2]) / 2.;
	}

	if (ngood)  *ngood  = ngoodpix;
	if (minval) *minval = xminval;
	if (maxval) *maxval = xmaxval;
	if (noise2)  *noise2  = 1.0483579 * xnoise2;
	if (noise3)  *noise3  = 0.6052697 * xnoise3;
	if (noise5)  *noise5  = 0.1772048 * xnoise5;

	free(diffs5);
	free(diffs3);
	free(diffs2);
	free(differences5);
	free(differences3);
	free(differences2);

	return(*status);
}